

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Reader.cpp
# Opt level: O2

void __thiscall adios2::core::engine::BP5Reader::PerformRemoteGets(BP5Reader *this)

{
  Remote *pRVar1;
  pointer ppvVar2;
  int iVar3;
  undefined4 extraout_var;
  pointer p_Var4;
  _Result<bool> *p_Var5;
  ulong uVar6;
  _State_baseV2 *__tmp;
  long lVar7;
  __basic_future<bool> *__n;
  iterator __begin3;
  ulong uVar8;
  pointer ppvVar9;
  _State_baseV2 *__tmp_1;
  __allocator_type __a2;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ornladios[P]ADIOS2_source_adios2_engine_bp5_BP5Reader_cpp:701:26),_unsigned_long>_>,_bool>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ornladios[P]ADIOS2_source_adios2_engine_bp5_BP5Reader_cpp:701:26),_unsigned_long>_>,_bool>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_148;
  __state_type local_138;
  __allocator_type __a2_1;
  thread local_120;
  undefined8 local_118;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_110;
  type lf_WaitForGet;
  vector<std::future<bool>,_std::allocator<std::future<bool>_>_> futures;
  vector<void_*,_std::allocator<void_*>_> handles;
  mutex mutexReadRequests;
  __basic_future<bool> local_80;
  size_t nextHandle;
  size_t nHandles;
  vector<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
  GetRequests;
  anon_class_24_3_72065bc4 lf_GetNextHandle;
  
  std::
  vector<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
  ::vector(&GetRequests,&this->m_BP5Deserializer->PendingGetRequests);
  lf_WaitForGet.handles = &handles;
  handles.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  handles.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  handles.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  lf_GetNextHandle.mutexReadRequests = &mutexReadRequests;
  for (; ppvVar2 = handles.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_finish,
      GetRequests.
      super__Vector_base<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      GetRequests.
      super__Vector_base<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
      ._M_impl.super__Vector_impl_data._M_finish;
      GetRequests.
      super__Vector_base<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
      ._M_impl.super__Vector_impl_data._M_start =
           GetRequests.
           super__Vector_base<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
           ._M_impl.super__Vector_impl_data._M_start + 1) {
    pRVar1 = (this->m_Remote)._M_t.
             super___uniq_ptr_impl<adios2::Remote,_std::default_delete<adios2::Remote>_>._M_t.
             super__Tuple_impl<0UL,_adios2::Remote_*,_std::default_delete<adios2::Remote>_>.
             super__Head_base<0UL,_adios2::Remote_*,_false>._M_head_impl;
    iVar3 = (*pRVar1->_vptr_Remote[5])
                      (pRVar1,(GetRequests.
                               super__Vector_base<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
                               ._M_impl.super__Vector_impl_data._M_start)->VarName,
                       (GetRequests.
                        super__Vector_base<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
                        ._M_impl.super__Vector_impl_data._M_start)->RelStep,
                       (GetRequests.
                        super__Vector_base<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
                        ._M_impl.super__Vector_impl_data._M_start)->StepCount,
                       (GetRequests.
                        super__Vector_base<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
                        ._M_impl.super__Vector_impl_data._M_start)->BlockID,
                       &(GetRequests.
                         super__Vector_base<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
                         ._M_impl.super__Vector_impl_data._M_start)->Count,
                       &(GetRequests.
                         super__Vector_base<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
                         ._M_impl.super__Vector_impl_data._M_start)->Start,
                       *(long *)((long)(GetRequests.
                                        super__Vector_base<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->VarRec + 8) +
                       0x128,(GetRequests.
                              super__Vector_base<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
                              ._M_impl.super__Vector_impl_data._M_start)->Data);
    mutexReadRequests.super___mutex_base._M_mutex.__align = CONCAT44(extraout_var,iVar3);
    std::vector<void_*,_std::allocator<void_*>_>::push_back
              (lf_WaitForGet.handles,(value_type *)lf_GetNextHandle.mutexReadRequests);
  }
  nHandles = (long)handles.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)handles.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
  lf_WaitForGet.nHandles = &nHandles;
  lf_GetNextHandle.nextHandle = &nextHandle;
  nextHandle = 0;
  mutexReadRequests.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  mutexReadRequests.super___mutex_base._M_mutex._16_8_ = 0;
  mutexReadRequests.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  mutexReadRequests.super___mutex_base._M_mutex.__align = 0;
  mutexReadRequests.super___mutex_base._M_mutex._8_8_ = 0;
  lf_WaitForGet.lf_GetNextHandle = &lf_GetNextHandle;
  uVar6 = (ulong)this->m_Threads;
  ppvVar9 = handles.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  lf_WaitForGet.this = this;
  lf_GetNextHandle.nHandles = lf_WaitForGet.nHandles;
  if ((uVar6 < 2) || (nHandles < 2)) {
    for (; ppvVar9 != ppvVar2; ppvVar9 = ppvVar9 + 1) {
      pRVar1 = (this->m_Remote)._M_t.
               super___uniq_ptr_impl<adios2::Remote,_std::default_delete<adios2::Remote>_>._M_t.
               super__Tuple_impl<0UL,_adios2::Remote_*,_std::default_delete<adios2::Remote>_>.
               super__Head_base<0UL,_adios2::Remote_*,_false>._M_head_impl;
      (*pRVar1->_vptr_Remote[6])(pRVar1,*ppvVar9);
    }
  }
  else {
    if (nHandles < uVar6) {
      uVar6 = nHandles;
    }
    __n = (__basic_future<bool> *)(uVar6 - 1);
    std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>::vector
              (&futures,(size_type)__n,(allocator_type *)&local_148);
    lVar7 = 0;
    for (uVar8 = 1; uVar6 != uVar8; uVar8 = uVar8 + 1) {
      local_138.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_138.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var4 = (pointer)operator_new(0x70);
      local_148._M_alloc = &__a2;
      (p_Var4->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
      (p_Var4->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
      (p_Var4->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_0081d950;
      *(undefined8 *)((long)&(p_Var4->_M_impl)._M_storage._M_storage + 8) = 0;
      *(undefined4 *)((long)&(p_Var4->_M_impl)._M_storage._M_storage + 0x10) = 0;
      (p_Var4->_M_impl)._M_storage._M_storage.__data[0x14] = '\0';
      *(undefined4 *)((long)&(p_Var4->_M_impl)._M_storage._M_storage + 0x18) = 0;
      *(undefined8 *)((long)&(p_Var4->_M_impl)._M_storage._M_storage + 0x20) = 0;
      *(undefined4 *)((long)&(p_Var4->_M_impl)._M_storage._M_storage + 0x28) = 0;
      (p_Var4->_M_impl)._M_storage._M_storage.__align =
           (anon_struct_8_0_00000001_for___align)&PTR___Async_state_impl_0081d9a0;
      local_148._M_ptr = p_Var4;
      p_Var5 = (_Result<bool> *)operator_new(0x18);
      std::__future_base::_Result<bool>::_Result(p_Var5);
      *(_Result<bool> **)((long)&(p_Var4->_M_impl)._M_storage._M_storage + 0x30) = p_Var5;
      *(ulong *)((long)&(p_Var4->_M_impl)._M_storage._M_storage + 0x38) = uVar8;
      *(anon_class_24_3_72065bc4 **)((long)&(p_Var4->_M_impl)._M_storage._M_storage + 0x40) =
           lf_WaitForGet.lf_GetNextHandle;
      *(size_t **)((long)&(p_Var4->_M_impl)._M_storage._M_storage + 0x48) = lf_WaitForGet.nHandles;
      *(BP5Reader **)((long)&(p_Var4->_M_impl)._M_storage._M_storage + 0x50) = lf_WaitForGet.this;
      *(vector<void_*,_std::allocator<void_*>_> **)
       ((long)&(p_Var4->_M_impl)._M_storage._M_storage + 0x58) = lf_WaitForGet.handles;
      local_120._M_id._M_thread = (id)0;
      ___a2_1 = (long *)operator_new(0x20);
      *___a2_1 = (long)&PTR___State_0081d9f8;
      ___a2_1[1] = (long)&p_Var4->_M_impl;
      ___a2_1[2] = (long)std::__future_base::
                         _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/engine/bp5/BP5Reader.cpp:701:26),_unsigned_long>_>,_bool>
                         ::_M_run;
      ___a2_1[3] = 0;
      std::thread::_M_start_thread(&local_120,&__a2_1,0);
      if (___a2_1 != (long *)0x0) {
        (**(code **)(*___a2_1 + 8))();
      }
      std::thread::operator=
                ((thread *)((long)&(p_Var4->_M_impl)._M_storage._M_storage + 0x20),&local_120);
      std::thread::~thread(&local_120);
      local_148._M_ptr = (pointer)0x0;
      std::
      __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/engine/bp5/BP5Reader.cpp:701:26),_unsigned_long>_>,_bool>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/engine/bp5/BP5Reader.cpp:701:26),_unsigned_long>_>,_bool>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
      ::~__allocated_ptr(&local_148);
      local_118 = 0;
      _Stack_110._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_148._M_alloc =
           (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ornladios[P]ADIOS2_source_adios2_engine_bp5_BP5Reader_cpp:701:26),_unsigned_long>_>,_bool>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ornladios[P]ADIOS2_source_adios2_engine_bp5_BP5Reader_cpp:701:26),_unsigned_long>_>,_bool>_>,_(__gnu_cxx::_Lock_policy)2>_>
            *)local_138.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
      local_148._M_ptr =
           (pointer)local_138.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      local_138.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)&p_Var4->_M_impl;
      local_138.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_148._M_ptr);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_110);
      if (local_138.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          == (element_type *)0x0) {
        p_Var4 = (pointer)operator_new(0x60);
        local_148._M_alloc =
             (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ornladios[P]ADIOS2_source_adios2_engine_bp5_BP5Reader_cpp:701:26),_unsigned_long>_>,_bool>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ornladios[P]ADIOS2_source_adios2_engine_bp5_BP5Reader_cpp:701:26),_unsigned_long>_>,_bool>_>,_(__gnu_cxx::_Lock_policy)2>_>
              *)&__a2_1;
        (p_Var4->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
        (p_Var4->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
        (p_Var4->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
             (_func_int **)&PTR___Sp_counted_ptr_inplace_0081da38;
        *(undefined8 *)((long)&(p_Var4->_M_impl)._M_storage._M_storage + 8) = 0;
        *(undefined4 *)((long)&(p_Var4->_M_impl)._M_storage._M_storage + 0x10) = 0;
        (p_Var4->_M_impl)._M_storage._M_storage.__data[0x14] = '\0';
        *(undefined4 *)((long)&(p_Var4->_M_impl)._M_storage._M_storage + 0x18) = 0;
        (p_Var4->_M_impl)._M_storage._M_storage.__align =
             (anon_struct_8_0_00000001_for___align)&PTR___Deferred_state_0081da88;
        local_148._M_ptr = p_Var4;
        p_Var5 = (_Result<bool> *)operator_new(0x18);
        std::__future_base::_Result<bool>::_Result(p_Var5);
        *(_Result<bool> **)((long)&(p_Var4->_M_impl)._M_storage._M_storage + 0x20) = p_Var5;
        *(ulong *)((long)&(p_Var4->_M_impl)._M_storage._M_storage + 0x28) = uVar8;
        *(anon_class_24_3_72065bc4 **)((long)&(p_Var4->_M_impl)._M_storage._M_storage + 0x30) =
             lf_WaitForGet.lf_GetNextHandle;
        *(size_t **)((long)&(p_Var4->_M_impl)._M_storage._M_storage + 0x38) = lf_WaitForGet.nHandles
        ;
        *(BP5Reader **)((long)&(p_Var4->_M_impl)._M_storage._M_storage + 0x40) = lf_WaitForGet.this;
        *(vector<void_*,_std::allocator<void_*>_> **)
         ((long)&(p_Var4->_M_impl)._M_storage._M_storage + 0x48) = lf_WaitForGet.handles;
        local_148._M_ptr = (pointer)0x0;
        std::
        __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/engine/bp5/BP5Reader.cpp:701:26),_unsigned_long>_>,_bool>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/engine/bp5/BP5Reader.cpp:701:26),_unsigned_long>_>,_bool>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
        ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ornladios[P]ADIOS2_source_adios2_engine_bp5_BP5Reader_cpp:701:26),_unsigned_long>_>,_bool>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ornladios[P]ADIOS2_source_adios2_engine_bp5_BP5Reader_cpp:701:26),_unsigned_long>_>,_bool>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                            *)&local_148);
        local_118 = 0;
        _Stack_110._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_148._M_alloc =
             (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ornladios[P]ADIOS2_source_adios2_engine_bp5_BP5Reader_cpp:701:26),_unsigned_long>_>,_bool>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ornladios[P]ADIOS2_source_adios2_engine_bp5_BP5Reader_cpp:701:26),_unsigned_long>_>,_bool>_>,_(__gnu_cxx::_Lock_policy)2>_>
              *)local_138.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
        local_148._M_ptr =
             (pointer)local_138.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
        local_138.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)&p_Var4->_M_impl;
        local_138.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_148._M_ptr);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_110);
      }
      std::__basic_future<bool>::__basic_future(&local_80,&local_138);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_138.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      __n = &local_80;
      std::future<bool>::operator=
                ((future<bool> *)
                 ((long)&((futures.
                           super__Vector_base<std::future<bool>,_std::allocator<std::future<bool>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->super___basic_future<bool>).
                         _M_state.
                         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr + lVar7),(future<bool> *)&local_80);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_80._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      lVar7 = lVar7 + 0x10;
    }
    std::
    tuple_element<0UL,_std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/engine/bp5/BP5Reader.cpp:701:26),_unsigned_long>_>
    ::type::operator()(&lf_WaitForGet,(size_t)__n);
    for (; futures.super__Vector_base<std::future<bool>,_std::allocator<std::future<bool>_>_>.
           _M_impl.super__Vector_impl_data._M_start !=
           futures.super__Vector_base<std::future<bool>,_std::allocator<std::future<bool>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
        futures.super__Vector_base<std::future<bool>,_std::allocator<std::future<bool>_>_>._M_impl.
        super__Vector_impl_data._M_start =
             futures.super__Vector_base<std::future<bool>,_std::allocator<std::future<bool>_>_>.
             _M_impl.super__Vector_impl_data._M_start + 1) {
      std::future<bool>::get
                (futures.super__Vector_base<std::future<bool>,_std::allocator<std::future<bool>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>::~vector(&futures);
  }
  std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
            (&handles.super__Vector_base<void_*,_std::allocator<void_*>_>);
  std::
  vector<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
  ::~vector(&GetRequests);
  return;
}

Assistant:

void BP5Reader::PerformRemoteGets()
{
    // TP startGenerate = NOW();
    auto GetRequests = m_BP5Deserializer->PendingGetRequests;
    std::vector<Remote::GetHandle> handles;
    for (auto &Req : GetRequests)
    {
        VariableBase *VB = m_BP5Deserializer->GetVariableBaseFromBP5VarRec(Req.VarRec);
        auto handle = m_Remote->Get(Req.VarName, Req.RelStep, Req.StepCount, Req.BlockID, Req.Count,
                                    Req.Start, VB->m_AccuracyRequested, Req.Data);
        handles.push_back(handle);
    }

    size_t nHandles = handles.size();
    // TP endGenerate = NOW();
    // double generateTime = DURATION(startGenerate, endGenerate);

    size_t nextHandle = 0;
    std::mutex mutexReadRequests;

    auto lf_GetNextHandle = [&]() -> size_t {
        std::lock_guard<std::mutex> lockGuard(mutexReadRequests);
        size_t reqidx = MaxSizeT;
        if (nextHandle < nHandles)
        {
            reqidx = nextHandle;
            ++nextHandle;
        }
        return reqidx;
    };

    auto lf_WaitForGet = [&](const size_t threadID) -> bool {
        while (true)
        {
            const auto reqidx = lf_GetNextHandle();
            if (reqidx > nHandles)
            {
                break;
            }
            m_Remote->WaitForGet(handles[reqidx]);
            // std::cout << "BP5Reader::PerformRemoteGets: thread " << threadID
            //           << " done with response " << reqidx << std::endl;
        }
        return true;
    };

    if (m_Threads > 1 && nHandles > 1)
    {
        size_t nThreads = (m_Threads < nHandles ? m_Threads : nHandles);
        std::vector<std::future<bool>> futures(nThreads - 1);

        // launch Threads-1 threads to process subsets of handles,
        // then main thread process the last subset
        for (size_t tid = 0; tid < nThreads - 1; ++tid)
        {
            futures[tid] = std::async(std::launch::async, lf_WaitForGet, tid + 1);
        }

        // main thread runs last subset of reads
        lf_WaitForGet(0);

        // wait for all async threads
        for (auto &f : futures)
        {
            f.get();
        }
    }
    else
    {
        for (auto &handle : handles)
        {
            m_Remote->WaitForGet(handle);
        }
    }
}